

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir_Resampler.cpp
# Opt level: O2

double __thiscall
Fir_Resampler_::time_ratio(Fir_Resampler_ *this,double new_factor,double rolloff,double gain)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  sample_t_conflict1 sVar7;
  int r;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  sample_t_conflict1 *psVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double __x;
  double dVar20;
  undefined1 local_e8 [16];
  double step;
  double local_b8;
  double pow_a_n;
  
  this->res = -1;
  local_b8 = 2.0;
  dVar17 = 0.0;
  dVar19 = 1.0;
  uVar13 = 0xffffffff;
  local_e8 = ZEXT816(0);
  for (uVar8 = 1; uVar8 != 0x21; uVar8 = uVar8 + 1) {
    dVar17 = dVar17 + new_factor;
    dVar2 = floor(dVar17 + 0.5);
    if (ABS(dVar17 - dVar2) < local_b8) {
      this->res = uVar8;
      local_e8._8_4_ = extraout_XMM0_Dc;
      local_e8._0_8_ = dVar2 / dVar19;
      local_e8._12_4_ = extraout_XMM0_Dd;
      local_b8 = ABS(dVar17 - dVar2);
      uVar13 = uVar8;
    }
    dVar19 = dVar19 + 1.0;
  }
  this->skip_bits = 0;
  dVar17 = floor((double)local_e8._0_8_);
  this->step = (int)dVar17 * 2;
  this->ratio_ = (double)local_e8._0_8_;
  dVar19 = fmod((double)local_e8._0_8_,1.0);
  this->input_per_cycle = 0;
  dVar2 = (double)(-(ulong)((double)local_e8._0_8_ < 1.0) & 0x3ff0000000000000 |
                  ~-(ulong)((double)local_e8._0_8_ < 1.0) & (ulong)(1.0 / (double)local_e8._0_8_));
  iVar1 = this->width_;
  psVar11 = this->impulses;
  dVar15 = (double)__powidf2(SUB84(rolloff,0),0x100);
  dVar16 = gain * dVar2 * 63.998046875;
  uVar10 = 0;
  uVar14 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar14 = uVar10;
  }
  dVar18 = 0.0;
  uVar8 = 0;
  iVar12 = 0;
  for (; uVar10 != uVar14; uVar10 = uVar10 + 1) {
    __x = (dVar18 + (double)(iVar1 / 2 + -1)) * dVar2 * -0.01227184630308513;
    for (lVar9 = 0; iVar1 != (int)lVar9; lVar9 = lVar9 + 1) {
      dVar20 = __x * 512.0 * (1.0 / (double)(int)((int)((double)iVar1 * dVar2 + 1.0) & 0xfffffffe));
      if (3.141592653589793 <= ABS(dVar20)) {
        sVar7 = 0;
      }
      else {
        dVar3 = cos(__x);
        dVar4 = 1.0 - dVar3 * rolloff;
        dVar5 = cos(__x * 256.0);
        dVar6 = cos(__x * 255.0);
        dVar3 = (((dVar6 * dVar15 * rolloff - dVar5 * dVar15) + dVar4) * dVar16) /
                ((rolloff * rolloff - dVar3 * rolloff) + dVar4) - dVar16;
        dVar20 = cos(dVar20);
        sVar7 = (sample_t_conflict1)(int)(dVar20 * dVar3 + dVar3);
      }
      psVar11[lVar9] = sVar7;
      __x = __x + dVar2 * 0.01227184630308513;
    }
    dVar18 = dVar18 + dVar19;
    iVar12 = iVar12 + (int)dVar17 * 2;
    this->input_per_cycle = iVar12;
    if (0.9999999 <= dVar18) {
      dVar18 = dVar18 + -1.0;
      uVar8 = uVar8 | 1 << ((uint)uVar10 & 0x1f);
      this->skip_bits = uVar8;
      iVar12 = iVar12 + 1;
      this->input_per_cycle = iVar12;
    }
    psVar11 = psVar11 + iVar1;
  }
  clear(this);
  return this->ratio_;
}

Assistant:

double Fir_Resampler_::time_ratio( double new_factor, double rolloff, double gain )
{
	ratio_ = new_factor;
	
	double fstep = 0.0;
	{
		double least_error = 2;
		double pos = 0;
		res = -1;
		for ( int r = 1; r <= max_res; r++ )
		{
			pos += ratio_;
			double nearest = floor( pos + 0.5 );
			double error = fabs( pos - nearest );
			if ( error < least_error )
			{
				res = r;
				fstep = nearest / res;
				least_error = error;
			}
		}
	}
	
	skip_bits = 0;
	
	step = stereo * (int) floor( fstep );
	
	ratio_ = fstep;
	fstep = fmod( fstep, 1.0 );
	
	double filter = (ratio_ < 1.0) ? 1.0 : 1.0 / ratio_;
	double pos = 0.0;
	input_per_cycle = 0;
	for ( int i = 0; i < res; i++ )
	{
		gen_sinc( rolloff, int (width_ * filter + 1) & ~1, pos, filter,
				double (0x7FFF * gain * filter),
				(int) width_, impulses + i * width_ );
		
		pos += fstep;
		input_per_cycle += step;
		if ( pos >= 0.9999999 )
		{
			pos -= 1.0;
			skip_bits |= 1 << i;
			input_per_cycle++;
		}
	}
	
	clear();
	
	return ratio_;
}